

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O0

void __thiscall Dashel::Stream::~Stream(Stream *this)

{
  Stream *this_local;
  
  this->_vptr_Stream = (_func_int **)&PTR__Stream_00151688;
  std::__cxx11::string::~string((string *)&this->protocolName);
  ParameterSet::~ParameterSet(&this->target);
  std::__cxx11::string::~string((string *)&this->failReason);
  return;
}

Assistant:

virtual ~Stream() { /* intentionally blank */}